

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.cpp
# Opt level: O1

idx_t __thiscall
duckdb::roaring::ContainerMetadataCollection::GetMetadataSize
          (ContainerMetadataCollection *this,idx_t container_count,idx_t run_containers,
          idx_t array_containers)

{
  unsigned_long uVar1;
  
  if ((container_count & 0x1f) != 0) {
    uVar1 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)container_count & 0x1f);
    container_count = (container_count - uVar1) + 0x20;
  }
  if ((run_containers & 0x1f) != 0) {
    uVar1 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)run_containers & 0x1f);
    run_containers = (run_containers - uVar1) + 0x20;
  }
  return (container_count >> 2 & 0x1fffffffffffffff) + array_containers + (run_containers * 7 >> 3);
}

Assistant:

idx_t ContainerMetadataCollection::GetMetadataSize(idx_t container_count, idx_t run_containers,
                                                   idx_t array_containers) const {
	idx_t types_size = BitpackingPrimitives::GetRequiredSize(container_count, CONTAINER_TYPE_BITWIDTH);
	idx_t runs_size = BitpackingPrimitives::GetRequiredSize(run_containers, RUN_CONTAINER_SIZE_BITWIDTH);
	idx_t arrays_size = sizeof(uint8_t) * array_containers;
	return types_size + runs_size + arrays_size;
}